

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

void printImageStats(char *name,Image *image,ImageMetadata *metadata)

{
  uint uVar1;
  uint uVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  bool bVar3;
  uint uVar4;
  Tuple2<pbrt::Point2,_int> TVar5;
  RGBColorSpace **ppRVar6;
  Point2<int> *pPVar7;
  Bounds2<int> *pBVar8;
  uint *puVar9;
  Point2i PVar10;
  float *pfVar11;
  undefined8 uVar12;
  optional *in_RDX;
  Image *in_RSI;
  undefined8 in_RDI;
  string *this;
  undefined8 in_R8;
  ulong uVar13;
  undefined4 uVar14;
  Float v;
  int x;
  int y;
  ImageChannelDesc desc;
  int nValid;
  int nInf;
  int nNaN;
  double sum;
  Float max;
  Float min;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *channel;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  string *str;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *iter;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  int m;
  int h;
  float s;
  RGBColorSpace *cs;
  int in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  WrapMode in_stack_fffffffffffffd6c;
  RGBColorSpace *in_stack_fffffffffffffd70;
  ImageChannelValues *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  Image *in_stack_fffffffffffffd98;
  SquareMatrix<4> *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffe38;
  Float in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int iVar15;
  int in_stack_fffffffffffffe4c;
  int iStack_1b0;
  int local_1ac;
  string local_1a0 [32];
  string *local_180;
  undefined8 local_178;
  ImageChannelDesc *in_stack_fffffffffffffeb0;
  Image *in_stack_fffffffffffffeb8;
  array<pbrt::WrapMode,_2> in_stack_fffffffffffffec0;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffec8;
  int local_12c;
  uint local_128;
  uint local_124;
  double local_120;
  float local_118;
  float local_114;
  reference local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  undefined1 *local_f8;
  undefined1 local_f0 [24];
  reference local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c0;
  reference local_b8;
  _Self local_b0;
  _Self local_a8;
  optional *local_a0;
  string local_98 [48];
  string local_68 [36];
  uint local_44;
  uint local_40;
  float local_3c;
  RGBColorSpace *local_38;
  PixelFormat local_2c;
  Tuple2<pbrt::Point2,_int> local_28;
  Tuple2<pbrt::Point2,_int> local_20;
  optional *local_18;
  Image *local_10;
  
  uVar14 = (undefined4)((ulong)in_R8 >> 0x20);
  local_18 = in_RDX;
  local_10 = in_RSI;
  TVar5 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(in_RSI);
  local_20 = TVar5;
  local_28 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_10);
  printf("%s:\n\tresolution (%d, %d)\n",in_RDI,(ulong)TVar5 & 0xffffffff,(ulong)local_28 >> 0x20);
  local_2c = pbrt::Image::Format(local_10);
  pbrt::Printf<pbrt::PixelFormat>
            ((char *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             (PixelFormat *)in_stack_fffffffffffffd88);
  printf("\tcolor space : ");
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0xc0);
  if ((bVar3) &&
     (ppRVar6 = pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                          ((optional<const_pbrt::RGBColorSpace_*> *)0x3db3c2),
     *ppRVar6 != (RGBColorSpace *)0x0)) {
    pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
              ((optional<const_pbrt::RGBColorSpace_*> *)0x3db3e0);
    bVar3 = pbrt::RGBColorSpace::operator==
                      (in_stack_fffffffffffffd70,
                       (RGBColorSpace *)
                       CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    if (bVar3) {
      printf("sRGB");
    }
    else {
      pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                ((optional<const_pbrt::RGBColorSpace_*> *)0x3db41f);
      bVar3 = pbrt::RGBColorSpace::operator==
                        (in_stack_fffffffffffffd70,
                         (RGBColorSpace *)
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      if (bVar3) {
        printf("DCI-P3");
      }
      else {
        pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                  ((optional<const_pbrt::RGBColorSpace_*> *)0x3db45e);
        bVar3 = pbrt::RGBColorSpace::operator==
                          (in_stack_fffffffffffffd70,
                           (RGBColorSpace *)
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
        if (bVar3) {
          printf("rec2020");
        }
        else {
          pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                    ((optional<const_pbrt::RGBColorSpace_*> *)0x3db49d);
          bVar3 = pbrt::RGBColorSpace::operator==
                            (in_stack_fffffffffffffd70,
                             (RGBColorSpace *)
                             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
          if (bVar3) {
            printf("ACES");
          }
          else {
            ppRVar6 = pstd::optional<const_pbrt::RGBColorSpace_*>::operator*
                                ((optional<const_pbrt::RGBColorSpace_*> *)0x3db4dc);
            local_38 = *ppRVar6;
            printf(" r: %f %f g: %f %f b: %f %f w: %f %f",
                   (double)(local_38->r).super_Tuple2<pbrt::Point2,_float>.x,
                   (double)(local_38->r).super_Tuple2<pbrt::Point2,_float>.y,
                   (double)(local_38->g).super_Tuple2<pbrt::Point2,_float>.x,
                   (double)(local_38->g).super_Tuple2<pbrt::Point2,_float>.y,
                   (double)(local_38->b).super_Tuple2<pbrt::Point2,_float>.x,
                   (double)(local_38->b).super_Tuple2<pbrt::Point2,_float>.y,
                   (double)(local_38->w).super_Tuple2<pbrt::Point2,_float>.x,
                   (double)(local_38->w).super_Tuple2<pbrt::Point2,_float>.y);
          }
        }
      }
    }
    printf("\n");
  }
  else {
    printf(" (unspecified)\n");
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0xa4);
  if (bVar3) {
    pPVar7 = pstd::optional<pbrt::Point2<int>_>::operator->
                       ((optional<pbrt::Point2<int>_> *)0x3db5cf);
    uVar4 = (pPVar7->super_Tuple2<pbrt::Point2,_int>).x;
    pPVar7 = pstd::optional<pbrt::Point2<int>_>::operator->
                       ((optional<pbrt::Point2<int>_> *)0x3db5ec);
    printf("\tfull resolution (%d, %d)\n",(ulong)uVar4,
           (ulong)(uint)(pPVar7->super_Tuple2<pbrt::Point2,_int>).y);
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0x90);
  if (bVar3) {
    pBVar8 = pstd::optional<pbrt::Bounds2<int>_>::operator->
                       ((optional<pbrt::Bounds2<int>_> *)0x3db635);
    uVar4 = (pBVar8->pMin).super_Tuple2<pbrt::Point2,_int>.x;
    pBVar8 = pstd::optional<pbrt::Bounds2<int>_>::operator->
                       ((optional<pbrt::Bounds2<int>_> *)0x3db652);
    uVar1 = (pBVar8->pMin).super_Tuple2<pbrt::Point2,_int>.y;
    pBVar8 = pstd::optional<pbrt::Bounds2<int>_>::operator->
                       ((optional<pbrt::Bounds2<int>_> *)0x3db670);
    uVar2 = (pBVar8->pMax).super_Tuple2<pbrt::Point2,_int>.x;
    pBVar8 = pstd::optional<pbrt::Bounds2<int>_>::operator->
                       ((optional<pbrt::Bounds2<int>_> *)0x3db68e);
    uVar13 = (ulong)(uint)(pBVar8->pMax).super_Tuple2<pbrt::Point2,_int>.y;
    printf("\tpixel bounds (%d, %d) - (%d, %d)\n",(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,uVar13);
    uVar14 = (undefined4)(uVar13 >> 0x20);
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18);
  if (bVar3) {
    pfVar11 = pstd::optional<float>::operator*((optional<float> *)0x3db6d8);
    local_40 = (int)*pfVar11 / 0xe10;
    local_3c = *pfVar11 - (float)(int)(local_40 * 0xe10);
    local_44 = (int)local_3c / 0x3c;
    local_3c = local_3c - (float)(int)(local_44 * 0x3c);
    printf("\trender time: %dh %dm %d.%02ds\n",(ulong)local_40,(ulong)local_44,
           (ulong)(uint)(int)local_3c,
           CONCAT44(uVar14,(int)((local_3c - (float)(int)local_3c) * 100.0)));
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 8);
  if (bVar3) {
    pstd::optional<pbrt::SquareMatrix<4>_>::operator->((optional<pbrt::SquareMatrix<4>_> *)0x3db7d3)
    ;
    pbrt::SquareMatrix<4>::ToString_abi_cxx11_(in_stack_fffffffffffffdb8);
    uVar12 = std::__cxx11::string::c_str();
    printf("\tcamera from world: %s\n",uVar12);
    std::__cxx11::string::~string(local_68);
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0x4c);
  if (bVar3) {
    pstd::optional<pbrt::SquareMatrix<4>_>::operator->((optional<pbrt::SquareMatrix<4>_> *)0x3db862)
    ;
    pbrt::SquareMatrix<4>::ToString_abi_cxx11_(in_stack_fffffffffffffdb8);
    uVar12 = std::__cxx11::string::c_str();
    printf("\tNDC from world: %s\n",uVar12);
    std::__cxx11::string::~string(local_98);
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0xb0);
  if (bVar3) {
    puVar9 = (uint *)pstd::optional<int>::operator*((optional<int> *)0x3db8f7);
    printf("\tsamples per pixel: %d\n",(ulong)*puVar9);
  }
  bVar3 = pstd::optional::operator_cast_to_bool(local_18 + 0xb8);
  if (bVar3) {
    pfVar11 = pstd::optional<float>::operator*((optional<float> *)0x3db935);
    printf("\tMSE vs. reference image: %g\n",(double)*pfVar11);
  }
  local_a0 = local_18 + 0xd0;
  local_a8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  while (bVar3 = std::operator!=(&local_a8,&local_b0), bVar3) {
    local_b8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)in_stack_fffffffffffffd60);
    uVar12 = std::__cxx11::string::c_str();
    printf("\t\"%s\": [ ",uVar12);
    local_c0 = &local_b8->second;
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffd60,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)),
          bVar3) {
      local_d8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_c8);
      uVar12 = std::__cxx11::string::c_str();
      printf("\"%s\" ",uVar12);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_c8);
    }
    printf("]\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffd60);
  }
  printf("\tChannels:\n");
  pbrt::Image::ChannelNames_abi_cxx11_(in_stack_fffffffffffffd98);
  local_f8 = local_f0;
  local_100._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffd60,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)), bVar3
        ) {
    local_110 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_100);
    local_114 = INFINITY;
    local_118 = -INFINITY;
    local_120 = 0.0;
    local_124 = 0;
    local_128 = 0;
    local_12c = 0;
    std::__cxx11::string::string(local_1a0,(string *)local_110);
    local_180 = local_1a0;
    local_178 = 1;
    v_00._M_array._4_4_ = in_stack_fffffffffffffd6c;
    v_00._M_array._0_4_ = in_stack_fffffffffffffd68;
    v_00._M_len = (size_type)in_stack_fffffffffffffd70;
    pstd::
    span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    span(in_stack_fffffffffffffd60,v_00);
    requestedChannels.ptr._4_4_ = in_stack_fffffffffffffe44;
    requestedChannels.ptr._0_4_ = in_stack_fffffffffffffe40;
    requestedChannels.n._0_4_ = in_stack_fffffffffffffe48;
    requestedChannels.n._4_4_ = in_stack_fffffffffffffe4c;
    pbrt::Image::GetChannelDesc
              ((Image *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               requestedChannels);
    this = (string *)&local_180;
    do {
      this = this + -0x20;
      std::__cxx11::string::~string(this);
    } while (this != local_1a0);
    local_1ac = 0;
    while( true ) {
      PVar10 = pbrt::Image::Resolution(local_10);
      in_stack_fffffffffffffe4c = PVar10.super_Tuple2<pbrt::Point2,_int>.x;
      iStack_1b0 = PVar10.super_Tuple2<pbrt::Point2,_int>.y;
      if (iStack_1b0 <= local_1ac) break;
      iVar15 = 0;
      while( true ) {
        in_stack_fffffffffffffe48 = iVar15;
        PVar10 = pbrt::Image::Resolution(local_10);
        in_stack_fffffffffffffe40 = PVar10.super_Tuple2<pbrt::Point2,_int>.x;
        in_stack_fffffffffffffe44 = PVar10.super_Tuple2<pbrt::Point2,_int>.y;
        if (in_stack_fffffffffffffe40 <= iVar15) break;
        pbrt::Point2<int>::Point2
                  ((Point2<int> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                   in_stack_fffffffffffffd58);
        pbrt::WrapMode2D::WrapMode2D
                  ((WrapMode2D *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
        pbrt::Image::GetChannels
                  (in_stack_fffffffffffffeb8,(Point2i)in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffeb0,(WrapMode2D)in_stack_fffffffffffffec0.values);
        in_stack_fffffffffffffe3c =
             pbrt::ImageChannelValues::operator_cast_to_float(in_stack_fffffffffffffd88);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3dbd3c);
        uVar4 = std::isnan((double)(ulong)(uint)in_stack_fffffffffffffe3c);
        if ((uVar4 & 1) == 0) {
          uVar4 = std::isinf((double)(ulong)(uint)in_stack_fffffffffffffe3c);
          if ((uVar4 & 1) == 0) {
            in_stack_fffffffffffffd60 =
                 (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)std::min<float>(&local_114,(float *)&stack0xfffffffffffffe3c);
            local_114 = *(float *)&in_stack_fffffffffffffd60->ptr;
            pfVar11 = std::max<float>(&local_118,(float *)&stack0xfffffffffffffe3c);
            local_118 = *pfVar11;
            local_120 = (double)in_stack_fffffffffffffe3c + local_120;
            local_12c = local_12c + 1;
          }
          else {
            local_128 = local_128 + 1;
          }
        }
        else {
          local_124 = local_124 + 1;
        }
        iVar15 = in_stack_fffffffffffffe48 + 1;
      }
      local_1ac = local_1ac + 1;
    }
    uVar12 = std::__cxx11::string::c_str();
    printf("\t    %20s: min %12g max %12g avg %12g (%d infinite, %d not-a-number)\n",
           (double)local_114,(double)local_118,local_120 / (double)local_12c,uVar12,(ulong)local_128
           ,(ulong)local_124);
    pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3dbfb1);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_100);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd70);
  return;
}

Assistant:

static void printImageStats(const char *name, const Image &image,
                            const ImageMetadata &metadata) {
    printf("%s:\n\tresolution (%d, %d)\n", name, image.Resolution().x,
           image.Resolution().y);
    Printf("\tpixel format: %s\n", image.Format());

    printf("\tcolor space : ");
    if (metadata.colorSpace && *metadata.colorSpace != nullptr) {
        if (**metadata.colorSpace == *RGBColorSpace::sRGB)
            printf("sRGB");
        else if (**metadata.colorSpace == *RGBColorSpace::DCI_P3)
            printf("DCI-P3");
        else if (**metadata.colorSpace == *RGBColorSpace::Rec2020)
            printf("rec2020");
        else if (**metadata.colorSpace == *RGBColorSpace::ACES2065_1)
            printf("ACES");
        else {
            const RGBColorSpace &cs = **metadata.colorSpace;
            printf(" r: %f %f g: %f %f b: %f %f w: %f %f", cs.r.x, cs.r.y, cs.g.x, cs.g.y,
                   cs.b.x, cs.b.y, cs.w.x, cs.w.y);
        }
        printf("\n");
    } else
        printf(" (unspecified)\n");

    if (metadata.fullResolution)
        printf("\tfull resolution (%d, %d)\n", metadata.fullResolution->x,
               metadata.fullResolution->y);
    if (metadata.pixelBounds)
        printf("\tpixel bounds (%d, %d) - (%d, %d)\n", metadata.pixelBounds->pMin.x,
               metadata.pixelBounds->pMin.y, metadata.pixelBounds->pMax.x,
               metadata.pixelBounds->pMax.y);
    if (metadata.renderTimeSeconds) {
        float s = *metadata.renderTimeSeconds;
        int h = int(s) / 3600;
        s -= h * 3600;
        int m = int(s) / 60;
        s -= m * 60;

        printf("\trender time: %dh %dm %d.%02ds\n", h, m, int(s),
               int(100 * (s - int(s))));
    }
    if (metadata.cameraFromWorld)
        printf("\tcamera from world: %s\n", metadata.cameraFromWorld->ToString().c_str());
    if (metadata.NDCFromWorld)
        printf("\tNDC from world: %s\n", metadata.NDCFromWorld->ToString().c_str());
    if (metadata.samplesPerPixel)
        printf("\tsamples per pixel: %d\n", *metadata.samplesPerPixel);

    if (metadata.MSE)
        printf("\tMSE vs. reference image: %g\n", *metadata.MSE);

    for (const auto &iter : metadata.stringVectors) {
        printf("\t\"%s\": [ ", iter.first.c_str());
        for (const std::string &str : iter.second)
            printf("\"%s\" ", str.c_str());
        printf("]\n");
    }

    printf("\tChannels:\n");

    std::vector<std::string> channelNames = image.ChannelNames();
    for (const auto &channel : channelNames) {
        Float min = Infinity, max = -Infinity;
        double sum = 0.;
        int nNaN = 0, nInf = 0, nValid = 0;
        ImageChannelDesc desc = image.GetChannelDesc({channel});

        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x) {
                Float v = image.GetChannels({x, y}, desc);

                if (std::isnan(v))
                    ++nNaN;
                else if (std::isinf(v))
                    ++nInf;
                else {
                    min = std::min(min, v);
                    max = std::max(max, v);
                    sum += v;
                    ++nValid;
                }
            }

        printf("\t    %20s: min %12g max %12g avg %12g (%d infinite, %d "
               "not-a-number)\n",
               channel.c_str(), min, max, sum / nValid, nInf, nNaN);
    }
}